

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::correctInput(HlslParseContext *this,TQualifier *qualifier)

{
  bool bVar1;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  clearUniform(this,qualifier);
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex) {
    TQualifier::clearInterstage(qualifier);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessEvaluation) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffefffffffffff;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
    TQualifier::clearInterpolation(qualifier);
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffdfffffffffff;
  }
  TQualifier::clearStreamLayout(qualifier);
  TQualifier::clearXfbLayout(qualifier);
  bVar1 = isInputBuiltIn(this,qualifier);
  if (!bVar1) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f;
  }
  return;
}

Assistant:

void HlslParseContext::correctInput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangVertex)
        qualifier.clearInterstage();
    if (language != EShLangTessEvaluation)
        qualifier.patch = false;
    if (language != EShLangFragment) {
        qualifier.clearInterpolation();
        qualifier.sample = false;
    }

    qualifier.clearStreamLayout();
    qualifier.clearXfbLayout();

    if (! isInputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}